

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  string local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  int local_54;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0014a3b0;
  if (this->read_fd_ == -1) {
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&(this->matcher_).
                    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  );
    return;
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"CHECK failed: File ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_f8);
  local_98 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_98 == plVar4) {
    local_88 = *plVar4;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar4;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_50 = (ulong *)*plVar2;
  puVar5 = (ulong *)(plVar2 + 2);
  if (local_50 == puVar5) {
    local_40 = *puVar5;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar5;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_54 = 0x19a;
  StreamableToString<int>(&local_78,&local_54);
  uVar7 = 0xf;
  if (local_50 != &local_40) {
    uVar7 = local_40;
  }
  if (uVar7 < local_78._M_string_length + local_48) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar8 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_48 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_50);
      goto LAB_0012ec33;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
LAB_0012ec33:
  local_30 = (undefined8 *)*puVar3;
  puVar1 = puVar3 + 2;
  if (local_30 == puVar1) {
    local_20 = *puVar1;
    uStack_18 = puVar3[3];
    local_30 = &local_20;
  }
  else {
    local_20 = *puVar1;
  }
  local_28 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  local_b8 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_b8 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_d8._M_dataplus._M_p = (pointer)*plVar2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_d8._M_dataplus._M_p == psVar6) {
    local_d8.field_2._M_allocated_capacity = *psVar6;
    local_d8.field_2._8_8_ = plVar2[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar6;
  }
  local_d8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  DeathTestAbort(&local_d8);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }